

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_geom_node_list(REF_GRID ref_grid,REF_LIST ref_list)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_CELL ref_cell_a;
  uint uVar2;
  uint unaff_EBX;
  REF_INT node;
  long lVar3;
  REF_INT nedgeid;
  REF_INT nfaceid;
  REF_INT edgeids [2];
  REF_INT faceids [3];
  int local_60;
  int local_5c;
  REF_LIST local_58;
  REF_CELL local_50;
  REF_INT local_44 [2];
  REF_INT local_3c [3];
  
  pRVar1 = ref_grid->node;
  if (0 < pRVar1->max) {
    ref_cell = ref_grid->cell[0];
    local_50 = ref_grid->cell[6];
    ref_cell_a = ref_grid->cell[3];
    lVar3 = 0;
    local_58 = ref_list;
    do {
      if ((-1 < pRVar1->global[lVar3]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar3])) {
        node = (REF_INT)lVar3;
        uVar2 = ref_cell_id_list_around(ref_cell,node,2,&local_60,local_44);
        if ((uVar2 != 0) && (uVar2 != 7)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3cf,"ref_interp_geom_node_list",(ulong)uVar2,"count faceids");
          unaff_EBX = uVar2;
        }
        if ((uVar2 != 7) && (uVar2 != 0)) {
          return unaff_EBX;
        }
        uVar2 = ref_cell_id_list_around_both(ref_cell_a,local_50,node,3,&local_5c,local_3c);
        if ((uVar2 != 0) && (uVar2 != 7)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3d1,"ref_interp_geom_node_list",(ulong)uVar2,"count faceids");
          unaff_EBX = uVar2;
        }
        if ((uVar2 != 7) && (uVar2 != 0)) {
          return unaff_EBX;
        }
        if (((2 < local_5c) || (1 < local_60)) && (uVar2 = ref_list_push(local_58,node), uVar2 != 0)
           ) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3d3,"ref_interp_geom_node_list",(ulong)uVar2,"add geom node");
          return uVar2;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pRVar1->max);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_geom_node_list(REF_GRID ref_grid,
                                                    REF_LIST ref_list) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_INT nfaceid, faceids[3];
  REF_INT nedgeid, edgeids[2];
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RXS(ref_cell_id_list_around(edg, node, 2, &nedgeid, edgeids),
          REF_INCREASE_LIMIT, "count faceids");
      RXS(ref_cell_id_list_around_both(tri, qua, node, 3, &nfaceid, faceids),
          REF_INCREASE_LIMIT, "count faceids");
      if (nfaceid >= 3 || nedgeid >= 2)
        RSS(ref_list_push(ref_list, node), "add geom node");
    }
  }
  return REF_SUCCESS;
}